

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_fma.cpp
# Opt level: O2

int __thiscall ncnn::MatMul_x86_fma::create_pipeline(MatMul_x86_fma *this,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  ModelBinFromMatArray local_28;
  
  pLVar1 = create_layer(0x4a);
  this->gemm = pLVar1;
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,2,0);
  ParamDict::set(&pd,3,*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86_fma[-3]));
  ParamDict::set(&pd,4,0);
  ParamDict::set(&pd,5,0);
  ParamDict::set(&pd,6,1);
  ParamDict::set(&pd,7,0);
  ParamDict::set(&pd,8,0);
  ParamDict::set(&pd,9,0);
  ParamDict::set(&pd,10,-1);
  ParamDict::set(&pd,0xb,0);
  ParamDict::set(&pd,0xc,1);
  (*this->gemm->_vptr_Layer[2])();
  pLVar1 = this->gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_28,(Mat *)0x0);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&local_28);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_28);
  (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
  ParamDict::~ParamDict(&pd);
  return 0;
}

Assistant:

int MatMul_x86_fma::create_pipeline(const Option& opt)
{
    gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

    ncnn::ParamDict pd;
    pd.set(2, 0);      // transA
    pd.set(3, transB); // transB
    pd.set(4, 0);      // constantA
    pd.set(5, 0);      // constantB
    pd.set(6, 1);      // constantC
    pd.set(7, 0);      // M = outch
    pd.set(8, 0);      // N = size
    pd.set(9, 0);      // K = maxk*inch
    pd.set(10, -1);    // constant_broadcast_type_C = null
    pd.set(11, 0);     // output_N1M
    pd.set(12, 1);     // output_elempack

    gemm->load_param(pd);

    gemm->load_model(ModelBinFromMatArray(0));

    gemm->create_pipeline(opt);

    return 0;
}